

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O2

void __thiscall
QBluetoothPermission::setCommunicationModes(QBluetoothPermission *this,CommunicationModes modes)

{
  CommunicationMode CVar1;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QFlagsStorage<QBluetoothPermission::CommunicationMode>)
      modes.super_QFlagsStorageHelper<QBluetoothPermission::CommunicationMode,_4>.
      super_QFlagsStorage<QBluetoothPermission::CommunicationMode>.i ==
      (QFlagsStorage<QBluetoothPermission::CommunicationMode>)0x0) {
    QtPrivateLogging::lcPermissions();
    CVar1 = Default;
    if (((byte)QtPrivateLogging::lcPermissions::category.field_2.bools.enabledWarning._q_value.
               _M_base._M_i & 1) != 0) {
      local_38.context.version = 2;
      local_38.context._4_8_ = 0;
      local_38.context._12_8_ = 0;
      local_38.context.function._4_4_ = 0;
      local_38.context.category = QtPrivateLogging::lcPermissions::category.name;
      QMessageLogger::warning
                (&local_38,
                 "QBluetoothPermission: trying to set an invalid empty mode. Falling back to CommunicationMode::Default."
                );
    }
  }
  else {
    CVar1 = (CommunicationMode)
            modes.super_QFlagsStorageHelper<QBluetoothPermission::CommunicationMode,_4>.
            super_QFlagsStorage<QBluetoothPermission::CommunicationMode>.i;
  }
  (this->u).data.mode = CVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBluetoothPermission::setCommunicationModes(CommunicationModes modes)
{
    if (modes == CommunicationModes{}) {
        qCWarning(lcPermissions, "QBluetoothPermission: trying to set an invalid empty mode. "
                                 "Falling back to CommunicationMode::Default.");
        u.data.mode = Default;
    } else {
        u.data.mode = static_cast<CommunicationMode>(modes.toInt());
    }
}